

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_encoder.h
# Opt level: O0

uint32_t handleQuantizeDenormTol(uint32_t abssrc,uint32_t tolSig,float errTol,float srcFloat)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint16_t in_SI;
  uint in_EDI;
  float in_XMM0_Da;
  float fVar5;
  float in_XMM1_Da;
  float smalldelta;
  float delta;
  int smallbits;
  int bits;
  uint32_t smallest;
  uint32_t alt;
  uint32_t mask2;
  uint32_t mask;
  uint32_t lowermask;
  uint32_t npow2;
  uint32_t tsigshift;
  float local_3c;
  int local_34;
  uint local_2c;
  
  iVar1 = countLeadingZeros(in_SI);
  uVar2 = 1 << (0x20U - (char)iVar1 & 0x1f);
  uVar3 = uVar2 - 1 ^ 0xffffffff;
  local_34 = countSetBits((uint16_t)in_EDI);
  uVar4 = in_EDI & (uVar3 ^ uVar2);
  iVar1 = countSetBits((uint16_t)uVar4);
  if (iVar1 < local_34) {
    fVar5 = half_to_float(0);
    local_3c = in_XMM0_Da;
    local_2c = in_EDI;
    if (in_XMM1_Da - fVar5 < in_XMM0_Da) {
      local_3c = in_XMM1_Da - fVar5;
      local_34 = iVar1;
      local_2c = uVar4;
    }
  }
  else {
    local_3c = in_XMM0_Da;
    local_2c = in_EDI;
    if (iVar1 == local_34) {
      fVar5 = half_to_float(0);
      local_3c = in_XMM0_Da;
      local_2c = in_EDI;
      if (in_XMM1_Da - fVar5 < in_XMM0_Da) {
        local_3c = in_XMM1_Da - fVar5;
        local_34 = iVar1;
        local_2c = uVar4;
      }
    }
  }
  uVar4 = in_EDI & uVar3;
  iVar1 = countSetBits((uint16_t)uVar4);
  if (iVar1 < local_34) {
    fVar5 = half_to_float(0);
    if (in_XMM1_Da - fVar5 < in_XMM0_Da) {
      local_3c = in_XMM1_Da - fVar5;
      local_34 = iVar1;
      local_2c = uVar4;
    }
  }
  else if (iVar1 == local_34) {
    fVar5 = half_to_float(0);
    if (in_XMM1_Da - fVar5 < local_3c) {
      local_3c = in_XMM1_Da - fVar5;
      local_34 = iVar1;
      local_2c = uVar4;
    }
  }
  uVar4 = in_EDI + uVar2 & uVar3;
  iVar1 = countSetBits((uint16_t)uVar4);
  if (iVar1 < local_34) {
    fVar5 = half_to_float(0);
    if (fVar5 - in_XMM1_Da < in_XMM0_Da) {
      local_3c = fVar5 - in_XMM1_Da;
      local_34 = iVar1;
      local_2c = uVar4;
    }
  }
  else if (iVar1 == local_34) {
    fVar5 = half_to_float(0);
    if (fVar5 - in_XMM1_Da < local_3c) {
      local_3c = fVar5 - in_XMM1_Da;
      local_34 = iVar1;
      local_2c = uVar4;
    }
  }
  uVar3 = in_EDI + uVar2 * 2 & uVar3;
  iVar1 = countSetBits((uint16_t)uVar3);
  if (iVar1 < local_34) {
    fVar5 = half_to_float(0);
    if (fVar5 - in_XMM1_Da < in_XMM0_Da) {
      local_2c = uVar3;
    }
  }
  else if ((iVar1 == local_34) && (fVar5 = half_to_float(0), fVar5 - in_XMM1_Da < local_3c)) {
    local_2c = uVar3;
  }
  return local_2c;
}

Assistant:

static uint32_t handleQuantizeDenormTol (
    uint32_t abssrc, uint32_t tolSig, float errTol, float srcFloat)
{
    const uint32_t tsigshift = (32 - countLeadingZeros (tolSig));
    const uint32_t npow2 = (1 << tsigshift);
    const uint32_t lowermask = npow2 - 1;
    const uint32_t mask = ~lowermask;
    const uint32_t mask2 = mask ^ npow2;

    uint32_t alt, smallest = abssrc;
    int bits, smallbits = countSetBits(abssrc);
    float delta, smalldelta = errTol;

    TEST_QUANT_ALTERNATE_SMALL(abssrc & mask2);
    TEST_QUANT_ALTERNATE_SMALL(abssrc & mask);
    TEST_QUANT_ALTERNATE_LARGE((abssrc + npow2) & mask);
    TEST_QUANT_ALTERNATE_LARGE((abssrc + (npow2 << 1)) & mask);

    return smallest;
}